

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSampler_Test::TestBody
          (Sampler_testProbabilisticSampler_Test *this)

{
  pointer *ppTVar1;
  char cVar2;
  long lVar3;
  Tag *__x;
  pointer pcVar4;
  char *pcVar5;
  ulong uVar6;
  AssertionResult gtest_ar_1;
  SamplingStatus result;
  AssertionResult gtest_ar;
  ProbabilisticSampler sampler;
  AssertionResult gtest_ar_;
  long *local_1d0;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_1c8;
  pointer *local_1a8;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_1a0;
  AssertHelper local_188 [8];
  undefined1 local_180 [16];
  anon_struct_8_0_00000001_for___align aStack_170;
  Tag local_168;
  undefined8 local_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  byte local_f8;
  undefined1 local_f0 [16];
  anon_struct_8_0_00000001_for___align aStack_e0;
  undefined1 local_d8 [24];
  string local_c0 [8];
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined8 local_70;
  undefined1 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  byte local_38;
  
  ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)local_f0,0.5);
  local_180._0_8_ = &aStack_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"op","");
  local_1a8 = (pointer *)CONCAT71(local_1a8._1_7_,0x8000000000000009 < (ulong)aStack_e0);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (&local_1a0,(vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_d8)
  ;
  if ((anon_struct_8_0_00000001_for___align *)local_180._0_8_ != &aStack_170) {
    operator_delete((void *)local_180._0_8_);
  }
  local_c0 = (string  [8])(CONCAT71(local_c0._1_7_,local_1a8._0_1_) ^ 1);
  local_b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  if (local_1a8._0_1_ == (string)0x0) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_c0 = (string  [8])0x2;
    local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(((long)local_1a0.
                          super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1a0.
                          super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_180,"sizeof(testProbablisticExpectedTags) / sizeof(Tag)",
               "(result.tags()).size()",(unsigned_long *)local_c0,(unsigned_long *)&local_1c8);
    if (local_180[0] == (string)0x0) {
      testing::Message::Message((Message *)local_c0);
      if ((anon_struct_8_0_00000001_for___align)local_180._8_8_ ==
          (anon_struct_8_0_00000001_for___align)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (((string *)local_180._8_8_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x77,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
      if (local_c0 != (string  [8])0x0) {
        cVar2 = testing::internal::IsTrue(true);
        if ((cVar2 != '\0') && (local_c0 != (string  [8])0x0)) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
        local_c0 = (string  [8])0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_180 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_180 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar3 = 0;
        uVar6 = 0;
        do {
          local_180._0_8_ = &sampling_manager::thrift::OperationSamplingStrategy::vtable;
          local_180._8_8_ = &local_168;
          aStack_170 = (anon_struct_8_0_00000001_for___align)0x0;
          local_168._key._M_dataplus._M_p = local_168._key._M_dataplus._M_p & 0xffffffffffffff00;
          local_168._key.field_2._M_allocated_capacity._0_4_ = 0;
          local_168._key.field_2._8_8_ = &local_168._value.super_variant_type.data;
          local_168._value.super_variant_type.type_index = 0;
          local_168._value.super_variant_type.data.__data[0] = '\0';
          local_168._value.super_variant_type.data._16_8_ = 0;
          local_168._value.super_variant_type.data.__data[0x18] = '\0';
          local_120 = 0;
          local_118 = local_108;
          local_110 = 0;
          local_108[0] = 0;
          local_f8 = local_f8 & 0xe0;
          local_c0 = (string  [8])&sampling_manager::thrift::OperationSamplingStrategy::vtable;
          local_b8._0_8_ = (long)local_b8 + 0x10;
          local_b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
          local_a8._16_4_ = 0;
          local_90 = local_a8 + 0x28;
          local_88 = 0;
          local_80[0] = 0;
          local_70 = 0;
          local_68 = 0;
          local_60 = 0;
          local_58 = local_48;
          local_50 = 0;
          local_48[0] = 0;
          local_38 = local_38 & 0xe0;
          jaegertracing::Tag::thrift
                    ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags + lVar3));
          jaegertracing::Tag::thrift
                    ((Tag *)((long)local_1a0.
                                   super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar3));
          testing::internal::CmpHelperEQ<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                    ((internal *)&local_1c8,"thriftTagArr","thriftTagVec",(Tag *)local_180,
                     (Tag *)local_c0);
          if (local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_start._0_1_ == (Message)0x0) {
            testing::Message::Message((Message *)&local_1d0);
            if ((anon_struct_8_0_00000001_for___align)
                local_1c8.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_finish == (anon_struct_8_0_00000001_for___align)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)local_1c8.
                                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
            }
            testing::internal::AssertHelper::AssertHelper
                      (local_188,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x77,pcVar5);
            testing::internal::AssertHelper::operator=(local_188,(Message *)&local_1d0);
            testing::internal::AssertHelper::~AssertHelper(local_188);
            if (local_1d0 != (long *)0x0) {
              cVar2 = testing::internal::IsTrue(true);
              if ((cVar2 != '\0') && (local_1d0 != (long *)0x0)) {
                (**(code **)(*local_1d0 + 8))();
              }
              local_1d0 = (long *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1c8.
                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_001bda0a;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1c8.
                      super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          jaegertracing::thrift::Tag::~Tag((Tag *)local_c0);
          jaegertracing::thrift::Tag::~Tag((Tag *)local_180);
          uVar6 = uVar6 + 1;
          lVar3 = lVar3 + 0x48;
        } while (uVar6 < (ulong)(((long)local_1a0.
                                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1a0.
                                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x71c71c71c71c71c7));
      }
      local_c0 = (string  [8])(local_b8 + 8);
      std::__cxx11::string::_M_construct<char_const*>(local_c0,"op","");
      local_180[0] = (string)(0x7fffffffffffffeb < (ulong)aStack_e0);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
                ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_180 + 8),
                 (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_d8);
      local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_1a8 = (pointer *)CONCAT71(local_1a8._1_7_,local_180[0]);
      local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_180._8_8_;
      local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)aStack_170;
      local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_168._key._M_dataplus._M_p;
      local_180._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      aStack_170 = (anon_struct_8_0_00000001_for___align)0x0;
      local_168._key._M_dataplus._M_p = (pointer)0x0;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_1c8);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_180 + 8))
      ;
      if (local_c0 != (string  [8])(local_b8 + 8)) {
        operator_delete((void *)local_c0);
      }
      local_c0[0] = local_1a8._0_1_;
      local_b8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      if (local_1a8._0_1_ == (string)0x0) {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)local_180,(char *)local_c0,"result.isSampled()","false");
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0x7b,(char *)local_180._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
        if ((anon_struct_8_0_00000001_for___align *)local_180._0_8_ != &aStack_170) {
          operator_delete((void *)local_180._0_8_);
        }
        if ((anon_struct_8_0_00000001_for___align)
            local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start != (anon_struct_8_0_00000001_for___align)0x0) {
          cVar2 = testing::internal::IsTrue(true);
          if ((cVar2 != '\0') &&
             ((anon_struct_8_0_00000001_for___align)
              local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_start != (anon_struct_8_0_00000001_for___align)0x0)
             ) {
            (**(code **)(*(long *)local_1c8.
                                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
          local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
        local_c0 = (string  [8])0x2;
        local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(((long)local_1a0.
                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1a0.
                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7)
        ;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_180,"sizeof(testProbablisticExpectedTags) / sizeof(Tag)",
                   "(result.tags()).size()",(unsigned_long *)local_c0,(unsigned_long *)&local_1c8);
        if (local_180[0] != (string)0x0) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_180 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar3 = 0;
            uVar6 = 0;
LAB_001bd3fa:
            local_180._0_8_ = &sampling_manager::thrift::OperationSamplingStrategy::vtable;
            local_180._8_8_ = &local_168;
            aStack_170 = (anon_struct_8_0_00000001_for___align)0x0;
            local_168._key._M_dataplus._M_p = local_168._key._M_dataplus._M_p & 0xffffffffffffff00;
            local_168._key.field_2._M_allocated_capacity._0_4_ = 0;
            local_168._key.field_2._8_8_ = &local_168._value.super_variant_type.data;
            local_168._value.super_variant_type.type_index = 0;
            local_168._value.super_variant_type.data.__data[0] = '\0';
            local_168._value.super_variant_type.data._16_8_ = 0;
            local_168._value.super_variant_type.data.__data[0x18] = '\0';
            local_120 = 0;
            local_118 = local_108;
            local_110 = 0;
            local_108[0] = 0;
            local_f8 = local_f8 & 0xe0;
            local_c0 = (string  [8])&sampling_manager::thrift::OperationSamplingStrategy::vtable;
            local_b8._0_8_ = (long)local_b8 + 0x10;
            local_b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
            local_a8._16_4_ = 0;
            local_90 = local_a8 + 0x28;
            local_88 = 0;
            local_80[0] = 0;
            local_70 = 0;
            local_68 = 0;
            local_60 = 0;
            local_58 = local_48;
            local_50 = 0;
            local_48[0] = 0;
            local_38 = local_38 & 0xe0;
            jaegertracing::Tag::thrift
                      ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags + lVar3));
            jaegertracing::Tag::thrift
                      ((Tag *)((long)local_1a0.
                                     super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar3));
            testing::internal::CmpHelperEQ<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                      ((internal *)&local_1c8,"thriftTagArr","thriftTagVec",(Tag *)local_180,
                       (Tag *)local_c0);
            if (local_1c8.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_start._0_1_ != (Message)0x0) goto LAB_001bd557;
            testing::Message::Message((Message *)&local_1d0);
            if ((anon_struct_8_0_00000001_for___align)
                local_1c8.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_finish == (anon_struct_8_0_00000001_for___align)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)local_1c8.
                                 super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
            }
            testing::internal::AssertHelper::AssertHelper
                      (local_188,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x7c,pcVar5);
            testing::internal::AssertHelper::operator=(local_188,(Message *)&local_1d0);
            testing::internal::AssertHelper::~AssertHelper(local_188);
            if (local_1d0 != (long *)0x0) {
              cVar2 = testing::internal::IsTrue(true);
              if ((cVar2 != '\0') && (local_1d0 != (long *)0x0)) {
                (**(code **)(*local_1d0 + 8))();
              }
              local_1d0 = (long *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1c8.
                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001bda0a:
            jaegertracing::thrift::Tag::~Tag((Tag *)local_c0);
            jaegertracing::thrift::Tag::~Tag((Tag *)local_180);
            goto LAB_001bdaa8;
          }
LAB_001bd59f:
          std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_1a0);
          local_f0._0_8_ = &PTR__ProbabilisticSampler_00210cc8;
          std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                    ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_d8);
          ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)local_180,1.0);
          local_f0._0_8_ = &aStack_e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"op","");
          __x = &local_168;
          local_c0[0] = (string)(aStack_170._7_1_ >> 7);
          std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
                    ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_b8,
                     (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)__x);
          if ((anon_struct_8_0_00000001_for___align *)local_f0._0_8_ != &aStack_e0) {
            operator_delete((void *)local_f0._0_8_);
          }
          local_1a8 = (pointer *)CONCAT71(local_1a8._1_7_,local_c0[0]);
          local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          if (local_c0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_1c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)local_f0,(char *)&local_1a8,"result.isSampled()","false");
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x82,(char *)local_f0._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1d0,(Message *)&local_1c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
            if ((anon_struct_8_0_00000001_for___align *)local_f0._0_8_ != &aStack_e0) {
              operator_delete((void *)local_f0._0_8_);
            }
            if ((anon_struct_8_0_00000001_for___align)
                local_1c8.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_start != (anon_struct_8_0_00000001_for___align)0x0) {
              cVar2 = testing::internal::IsTrue(true);
              if ((cVar2 != '\0') &&
                 ((anon_struct_8_0_00000001_for___align)
                  local_1c8.
                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (anon_struct_8_0_00000001_for___align)0x0)) {
                (**(code **)(*(long *)local_1c8.
                                      super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 8))();
              }
              local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            ppTVar1 = &local_1a0.
                       super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            local_1a8 = ppTVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"op","");
            local_f0[0] = (string)(0x7fffffffffffffeb < (ulong)aStack_170);
            std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
                      ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                       (local_f0 + 8),
                       (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)__x);
            local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8._0_8_;
            local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
            local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
            local_c0[0] = local_f0[0];
            local_b8._0_8_ = local_f0._8_8_;
            local_b8._8_8_ = aStack_e0;
            local_a8._0_8_ = local_d8._0_8_;
            local_f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            aStack_e0 = (anon_struct_8_0_00000001_for___align)0x0;
            local_d8._0_8_ = (pointer)0x0;
            std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                      (&local_1c8);
            std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                      ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                       (local_f0 + 8));
            if (local_1a8 != ppTVar1) {
              operator_delete(local_1a8);
            }
            local_1a8 = (pointer *)CONCAT71(local_1a8._1_7_,local_c0[0]);
            local_1a0.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            if (local_c0[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_1c8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)local_f0,(char *)&local_1a8,"result.isSampled()","false"
                        );
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_1d0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                         ,0x86,(char *)local_f0._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_1d0,(Message *)&local_1c8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
              if ((anon_struct_8_0_00000001_for___align *)local_f0._0_8_ != &aStack_e0) {
                operator_delete((void *)local_f0._0_8_);
              }
              if ((anon_struct_8_0_00000001_for___align)
                  local_1c8.
                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (anon_struct_8_0_00000001_for___align)0x0) {
                cVar2 = testing::internal::IsTrue(true);
                if ((cVar2 != '\0') &&
                   ((anon_struct_8_0_00000001_for___align)
                    local_1c8.
                    super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    (anon_struct_8_0_00000001_for___align)0x0)) {
                  (**(code **)(*(long *)local_1c8.
                                        super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 8))();
                }
                local_1c8.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                    ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_b8);
          local_180._0_8_ = &PTR__ProbabilisticSampler_00210cc8;
          goto LAB_001bdac9;
        }
        testing::Message::Message((Message *)local_c0);
        if ((anon_struct_8_0_00000001_for___align)local_180._8_8_ ==
            (anon_struct_8_0_00000001_for___align)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (((string *)local_180._8_8_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0x7c,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
        if (local_c0 != (string  [8])0x0) {
          cVar2 = testing::internal::IsTrue(true);
          if ((cVar2 != '\0') && (local_c0 != (string  [8])0x0)) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
          local_c0 = (string  [8])0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_180 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_180,(char *)local_c0,"result.isSampled()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0x76,(char *)local_180._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((anon_struct_8_0_00000001_for___align *)local_180._0_8_ != &aStack_170) {
      operator_delete((void *)local_180._0_8_);
    }
    if ((anon_struct_8_0_00000001_for___align)
        local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start != (anon_struct_8_0_00000001_for___align)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         ((anon_struct_8_0_00000001_for___align)
          local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
          _M_impl.super__Vector_impl_data._M_start != (anon_struct_8_0_00000001_for___align)0x0)) {
        (**(code **)(*(long *)local_1c8.
                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
LAB_001bdaa8:
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_1a0);
  local_f0._0_8_ = &PTR__ProbabilisticSampler_00210cc8;
  __x = (Tag *)local_d8;
LAB_001bdac9:
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)__x);
  return;
LAB_001bd557:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  jaegertracing::thrift::Tag::~Tag((Tag *)local_c0);
  jaegertracing::thrift::Tag::~Tag((Tag *)local_180);
  uVar6 = uVar6 + 1;
  lVar3 = lVar3 + 0x48;
  if ((ulong)(((long)local_1a0.
                     super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1a0.
                     super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) <= uVar6)
  goto LAB_001bd59f;
  goto LAB_001bd3fa;
}

Assistant:

TEST(Sampler, testProbabilisticSampler)
{
    {
        ProbabilisticSampler sampler(0.5);
        auto result =
            sampler.isSampled(TraceID(0, kTestMaxID + 10), kTestOperationName);
        ASSERT_FALSE(result.isSampled());
        CMP_TAGS(testProbablisticExpectedTags, result.tags());

        result =
            sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
        ASSERT_TRUE(result.isSampled());
        CMP_TAGS(testProbablisticExpectedTags, result.tags());
    }
    {
        ProbabilisticSampler sampler(1.0);
        auto result =
            sampler.isSampled(TraceID(0, kTestMaxID), kTestOperationName);
        ASSERT_TRUE(result.isSampled());

        result =
            sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
        ASSERT_TRUE(result.isSampled());
    }
}